

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall pegmatite::ASTParserDelegate::ASTParserDelegate(ASTParserDelegate *this)

{
  long lVar1;
  ASTParserDelegate *this_local;
  
  ParserDelegate::ParserDelegate(&this->super_ParserDelegate);
  (this->super_ParserDelegate)._vptr_ParserDelegate = (_func_int **)&PTR_get_parse_proc_0022e8c0;
  std::
  unordered_map<const_pegmatite::Rule_*,_std::function<bool_(const_pegmatite::InputRange_&,_void_*)>,_std::hash<const_pegmatite::Rule_*>,_std::equal_to<const_pegmatite::Rule_*>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::function<bool_(const_pegmatite::InputRange_&,_void_*)>_>_>_>
  ::unordered_map(&this->handlers);
  lVar1 = __tls_get_addr(&PTR_0022fad0);
  *(ASTParserDelegate **)(lVar1 + 8) = this;
  return;
}

Assistant:

ASTParserDelegate::ASTParserDelegate()
{
	currentParserDelegate = this;
}